

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

uint __thiscall llvm::yaml::Output::beginFlowSequence(Output *this)

{
  StringRef s;
  InState local_14;
  
  SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>::push_back
            ((SmallVectorTemplateBase<llvm::yaml::Output::InState,_true> *)&this->StateStack,
             &local_14);
  newLineCheck(this);
  this->ColumnAtFlowStart = this->Column;
  s.Length = 2;
  s.Data = "[ ";
  output(this,s);
  this->NeedFlowSequenceComma = false;
  return 0;
}

Assistant:

unsigned Output::beginFlowSequence() {
  StateStack.push_back(inFlowSeqFirstElement);
  newLineCheck();
  ColumnAtFlowStart = Column;
  output("[ ");
  NeedFlowSequenceComma = false;
  return 0;
}